

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

void __thiscall ON_wString::AppendToArray(ON_wString *this,ON_wString *s)

{
  wchar_t *pwVar1;
  wchar_t *s_00;
  ON_Internal_Empty_wString *pOVar2;
  
  pwVar1 = s->m_s;
  pOVar2 = &empty_wstring;
  if (pwVar1 != (wchar_t *)0x0) {
    pOVar2 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
  }
  s_00 = (wchar_t *)0x0;
  if (0 < (pOVar2->header).string_capacity) {
    s_00 = pwVar1;
  }
  AppendToArray(this,(pOVar2->header).string_length,s_00);
  return;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}